

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decompiler-ls.h
# Opt level: O0

void __thiscall
wabt::LoadStoreTracking::LoadStore
          (LoadStoreTracking *this,uint64_t offset,Opcode opc,Type type,Address align,Node *addr_exp
          )

{
  bool bVar1;
  Address AVar2;
  ulong uVar3;
  Type local_c0;
  Type local_b8;
  Type local_b0;
  Type local_a8;
  Type local_a0;
  Type local_98;
  mapped_type *local_90;
  mapped_type *access;
  mapped_type *var;
  undefined1 local_78 [8];
  string name;
  Address byte_size;
  Node *addr_exp_local;
  Address align_local;
  uint64_t offset_local;
  LoadStoreTracking *this_local;
  Type type_local;
  Opcode opc_local;
  
  align_local = offset;
  offset_local = (uint64_t)this;
  unique0x10000261 = type;
  type_local.enum_ = opc.enum_;
  AVar2 = Opcode::GetMemorySize((Opcode *)&type_local);
  name.field_2._12_4_ = type_local.enum_;
  register0x00000000 = GetMemoryType(stack0xffffffffffffffec,(Opcode)type_local.enum_);
  AddrExpName_abi_cxx11_((string *)local_78,this,addr_exp);
  uVar3 = std::__cxx11::string::empty();
  if ((uVar3 & 1) != 0) {
    var._4_4_ = 1;
    goto LAB_00216300;
  }
  access = (mapped_type *)
           std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_wabt::LoadStoreTracking::LSVar,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_wabt::LoadStoreTracking::LSVar>_>_>
           ::operator[](&this->vars,(key_type *)local_78);
  local_90 = std::
             map<unsigned_long,_wabt::LoadStoreTracking::LSAccess,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_wabt::LoadStoreTracking::LSAccess>_>_>
             ::operator[]((map<unsigned_long,_wabt::LoadStoreTracking::LSAccess,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_wabt::LoadStoreTracking::LSAccess>_>_>
                           *)access,&align_local);
  if (local_90->byte_size != 0) {
    if (local_90->byte_size == AVar2) {
      local_98 = local_90->type;
      local_a0 = stack0xffffffffffffffec;
      bVar1 = wabt::operator!=(local_98,stack0xffffffffffffffec);
      if ((!bVar1) && (local_90->align == align)) goto LAB_002161f4;
    }
    local_90->is_uniform = false;
  }
LAB_002161f4:
  bVar1 = Opcode::IsNaturallyAligned((Opcode *)&type_local,align);
  if (!bVar1) {
    local_90->is_uniform = false;
  }
  local_90->byte_size = AVar2;
  local_90->type = stack0xffffffffffffffec;
  local_90->align = align;
  local_a8 = *(Type *)((long)&access[1].align + 4);
  local_b0 = stack0xffffffffffffffec;
  bVar1 = wabt::operator==(local_a8,stack0xffffffffffffffec);
  if (bVar1) {
LAB_00216290:
    if ((access[2].byte_size != align) && (access[2].byte_size != 0xffffffffffffffff))
    goto LAB_002162cd;
    *(Type *)((long)&access[1].align + 4) = stack0xffffffffffffffec;
    access[2].byte_size = align;
    access[2].type.enum_ = type_local.enum_;
  }
  else {
    local_b8 = *(Type *)((long)&access[1].align + 4);
    bVar1 = wabt::operator==(local_b8,Any);
    if (bVar1) goto LAB_00216290;
LAB_002162cd:
    Type::Type(&local_c0,Void);
    *(Type *)((long)&access[1].align + 4) = local_c0;
    access[2].byte_size = 0xffffffffffffffff;
  }
  var._4_4_ = 0;
LAB_00216300:
  std::__cxx11::string::~string((string *)local_78);
  return;
}

Assistant:

void LoadStore(uint64_t offset,
                 Opcode opc,
                 Type type,
                 Address align,
                 const Node& addr_exp) {
    auto byte_size = opc.GetMemorySize();
    type = GetMemoryType(type, opc);
    // We want to associate memory ops of a certain offset & size as being
    // relative to a uniquely identifiable pointer, such as a local.
    auto name = AddrExpName(addr_exp);
    if (name.empty()) {
      return;
    }
    auto& var = vars[name];
    auto& access = var.accesses[offset];
    // Check if previous access at this offset (if any) is of same size
    // and type (see Checklayouts below).
    if (access.byte_size && ((access.byte_size != byte_size) ||
                             (access.type != type) || (access.align != align)))
      access.is_uniform = false;
    // Also exclude weird alignment accesses from structs.
    if (!opc.IsNaturallyAligned(align))
      access.is_uniform = false;
    access.byte_size = byte_size;
    access.type = type;
    access.align = align;
    // Additionally, check if all accesses are to the same type, so
    // if layout check fails, we can at least declare it as pointer to
    // a type.
    if ((var.same_type == type || var.same_type == Type::Any) &&
        (var.same_align == align || var.same_align == kInvalidAddress)) {
      var.same_type = type;
      var.same_align = align;
      var.last_opc = opc;
    } else {
      var.same_type = Type::Void;
      var.same_align = kInvalidAddress;
    }
  }